

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_timesamples_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,TimeSamples *v,uint32_t indent)

{
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar1;
  ostream *poVar2;
  uint32_t n;
  long lVar3;
  size_t i;
  ulong uVar4;
  undefined1 in_R8B;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  ::std::operator<<(local_1a8,"{\n");
  lVar3 = 8;
  uVar4 = 0;
  while( true ) {
    n = (uint32_t)((*(long *)(this + 8) - *(long *)this) % 0x28);
    if ((ulong)((*(long *)(this + 8) - *(long *)this) / 0x28) <= uVar4) break;
    pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)((int)v + 1),n);
    ::std::operator<<(local_1a8,(string *)&local_1d8);
    ::std::__cxx11::string::_M_dispose();
    pvVar1 = value::TimeSamples::get_samples((TimeSamples *)this);
    poVar2 = ::std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)(pvVar1->
                                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar3 + -8));
    poVar2 = ::std::operator<<(poVar2,": ");
    pvVar1 = value::TimeSamples::get_samples((TimeSamples *)this);
    value::pprint_value_abi_cxx11_
              (&local_1d8,
               (value *)((long)&((pvVar1->
                                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->t + lVar3),
               (Value *)0x0,1,(bool)in_R8B);
    ::std::operator<<(poVar2,(string *)&local_1d8);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,",\n");
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x28;
  }
  pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)v & 0xffffffff),n);
  poVar2 = ::std::operator<<(local_1a8,(string *)&local_1d8);
  ::std::operator<<(poVar2,"}\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string print_timesamples(const value::TimeSamples &v,
                              const uint32_t indent) {
  std::stringstream ss;

  ss << "{\n";

  for (size_t i = 0; i < v.size(); i++) {
    ss << pprint::Indent(indent + 1);
    ss << v.get_samples()[i].t << ": "
       << value::pprint_value(v.get_samples()[i].value);
    ss << ",\n";  // USDA allow ',' for the last item
  }
  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}